

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_tests.cpp
# Opt level: O3

void __thiscall MyEnvironment::~MyEnvironment(MyEnvironment *this)

{
  Environment *unaff_RBX;
  
  (this->super_Environment)._vptr_Environment = (_func_int **)&PTR__Environment_0012db18;
  iutest::TestEnv::ReleaseGlobalTestEnvironment(unaff_RBX);
  operator_delete(this,8);
  return;
}

Assistant:

class MyEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
public:
    static bool setup;
    static bool teardown;

public:
    void Reset(void)
    {
        setup = false;
        teardown = false;
    }